

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceValidators.cpp
# Opt level: O3

Result * CoreML::validateMultiFunctionDescription
                   (Result *__return_storage_ptr__,ModelDescription *interface,int modelVersion,
                   ValidationPolicy *validationPolicy)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 *puVar2;
  Rep *pRVar3;
  FunctionDescription *interface_00;
  Result *this;
  uint uVar4;
  bool bVar5;
  long *plVar6;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var7;
  undefined8 *puVar8;
  uint uVar9;
  size_type *psVar10;
  string *psVar11;
  ulong uVar12;
  uint __val;
  pointer pbVar13;
  _Alloc_hider _Var14;
  pointer pcVar15;
  undefined8 uVar16;
  long lVar17;
  long lVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  uint __len;
  string __str;
  string local_110;
  Result *local_f0;
  string *local_e8;
  long local_e0;
  undefined1 local_d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  pointer local_b8 [2];
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  ModelDescription *local_48;
  void **local_40;
  ulong local_38;
  
  if (validationPolicy->allowsMultipleFunctions == false) {
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,"This model type doesn\'t support multi-function syntax.","");
    Result::Result(__return_storage_ptr__,MODEL_TYPE_DOES_NOT_SUPPORT_MULTI_FUNCTION,&local_110);
    local_a8.field_2._M_allocated_capacity = local_110.field_2._M_allocated_capacity;
    _Var14._M_p = local_110._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p == &local_110.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_002ecebf;
  }
  local_38 = (ulong)(uint)modelVersion;
  local_f0 = __return_storage_ptr__;
  if (8 < modelVersion) {
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pRVar3 = (interface->functions_).super_RepeatedPtrFieldBase.rep_;
    local_40 = pRVar3->elements;
    if (pRVar3 == (Rep *)0x0) {
      local_40 = (void **)0x0;
    }
    lVar17 = (long)(interface->functions_).super_RepeatedPtrFieldBase.current_size_;
    if (lVar17 != 0) {
      paVar1 = &(__return_storage_ptr__->m_message).field_2;
      lVar18 = 0;
      local_48 = interface;
      do {
        interface_00 = *(FunctionDescription **)((long)local_40 + lVar18);
        validateFeatureDescriptions<CoreML::Specification::FunctionDescription>
                  (__return_storage_ptr__,interface_00,(int)local_38,validationPolicy);
        bVar5 = Result::good(__return_storage_ptr__);
        if (!bVar5) goto LAB_002ed06d;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_68,
                    (value_type *)
                    ((ulong)(interface_00->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
        pcVar15 = (local_f0->m_message)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar15 != paVar1) {
          operator_delete(pcVar15,paVar1->_M_allocated_capacity + 1);
        }
        lVar18 = lVar18 + 8;
        interface = local_48;
      } while (lVar17 * 8 != lVar18);
    }
    this = local_f0;
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((ulong)(interface->defaultfunctionname_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
    _Var7 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      (local_68.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       local_68.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,__rhs);
    if (_Var7._M_current !=
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      Result::Result(this);
      goto LAB_002ed06d;
    }
    std::operator+(&local_88,"The default function name \'",__rhs);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_88);
    psVar11 = (string *)(plVar6 + 2);
    if ((string *)*plVar6 == psVar11) {
      local_d8._0_8_ = (psVar11->_M_dataplus)._M_p;
      local_d8._8_8_ = plVar6[3];
      local_e8 = (string *)local_d8;
    }
    else {
      local_d8._0_8_ = (psVar11->_M_dataplus)._M_p;
      local_e8 = (string *)*plVar6;
    }
    local_e0 = plVar6[1];
    *plVar6 = (long)psVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    local_c8._M_allocated_capacity = (size_type)local_b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_d8 + 0x10),",","");
    componentsJoinedBy<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_a8,(CoreML *)&local_68,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_d8 + 0x10),psVar11);
    pcVar15 = (pointer)0xf;
    if (local_e8 != (string *)local_d8) {
      pcVar15 = (pointer)local_d8._0_8_;
    }
    if (pcVar15 < (pointer)(local_a8._M_string_length + local_e0)) {
      uVar16 = (pointer)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        uVar16 = local_a8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar16 < (pointer)(local_a8._M_string_length + local_e0)) goto LAB_002ecf6f;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,(ulong)local_e8);
    }
    else {
LAB_002ecf6f:
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_a8._M_dataplus._M_p);
    }
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    puVar2 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar2) {
      local_110.field_2._M_allocated_capacity = *puVar2;
      local_110.field_2._8_8_ = puVar8[3];
    }
    else {
      local_110.field_2._M_allocated_capacity = *puVar2;
      local_110._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_110._M_string_length = puVar8[1];
    *puVar8 = puVar2;
    puVar8[1] = 0;
    *(undefined1 *)puVar2 = 0;
    Result::Result(this,INVALID_DEFAULT_FUNCTION_NAME,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,
                      (ulong)(local_110.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,(ulong)(local_a8.field_2._M_allocated_capacity + 1))
      ;
    }
    if ((pointer *)local_c8._M_allocated_capacity != local_b8) {
      operator_delete((void *)local_c8._M_allocated_capacity,
                      (ulong)((long)&(local_b8[0]->_M_dataplus)._M_p + 1));
    }
    if (local_e8 != (string *)local_d8) {
      operator_delete(local_e8,(ulong)(local_d8._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
LAB_002ed06d:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_68);
    return local_f0;
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_a8,'\x01');
  *local_a8._M_dataplus._M_p = '9';
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,0x3b8c23);
  psVar10 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_88.field_2._M_allocated_capacity = *psVar10;
    local_88.field_2._8_8_ = plVar6[3];
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  }
  else {
    local_88.field_2._M_allocated_capacity = *psVar10;
    local_88._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_88._M_string_length = plVar6[1];
  *plVar6 = (long)psVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_88);
  psVar11 = (string *)(plVar6 + 2);
  if ((string *)*plVar6 == psVar11) {
    local_d8._0_8_ = (psVar11->_M_dataplus)._M_p;
    local_d8._8_8_ = plVar6[3];
    local_e8 = (string *)local_d8;
  }
  else {
    local_d8._0_8_ = (psVar11->_M_dataplus)._M_p;
    local_e8 = (string *)*plVar6;
  }
  local_e0 = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  __val = -modelVersion;
  if (0 < modelVersion) {
    __val = modelVersion;
  }
  __len = 1;
  if (9 < __val) {
    uVar12 = (ulong)__val;
    uVar4 = 4;
    do {
      __len = uVar4;
      uVar9 = (uint)uVar12;
      if (uVar9 < 100) {
        __len = __len - 2;
        goto LAB_002ecd50;
      }
      if (uVar9 < 1000) {
        __len = __len - 1;
        goto LAB_002ecd50;
      }
      if (uVar9 < 10000) goto LAB_002ecd50;
      uVar12 = uVar12 / 10000;
      uVar4 = __len + 4;
    } while (99999 < uVar9);
    __len = __len + 1;
  }
LAB_002ecd50:
  local_c8._M_allocated_capacity = (size_type)local_b8;
  std::__cxx11::string::_M_construct
            ((ulong)(local_d8 + 0x10),(char)__len - (char)(modelVersion >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)(((uint)modelVersion >> 0x1f) + local_c8._M_allocated_capacity),__len,__val);
  __return_storage_ptr__ = local_f0;
  pbVar13 = (pointer)0xf;
  if (local_e8 != (string *)local_d8) {
    pbVar13 = (pointer)local_d8._0_8_;
  }
  if (pbVar13 < (pointer)(local_c8._8_8_ + local_e0)) {
    pbVar13 = (pointer)0xf;
    if ((pointer *)local_c8._M_allocated_capacity != local_b8) {
      pbVar13 = local_b8[0];
    }
    if (pbVar13 < (pointer)(local_c8._8_8_ + local_e0)) goto LAB_002ecdc8;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)(local_d8 + 0x10),0,(char *)0x0,(ulong)local_e8);
  }
  else {
LAB_002ecdc8:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_e8,local_c8._M_allocated_capacity);
  }
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  puVar2 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_110.field_2._M_allocated_capacity = *puVar2;
    local_110.field_2._8_8_ = puVar8[3];
  }
  else {
    local_110.field_2._M_allocated_capacity = *puVar2;
    local_110._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_110._M_string_length = puVar8[1];
  *puVar8 = puVar2;
  puVar8[1] = 0;
  *(undefined1 *)puVar2 = 0;
  Result::Result(__return_storage_ptr__,INVALID_COMPATIBILITY_VERSION,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,(ulong)(local_110.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((pointer *)local_c8._M_allocated_capacity != local_b8) {
    operator_delete((void *)local_c8._M_allocated_capacity,
                    (ulong)((long)&(local_b8[0]->_M_dataplus)._M_p + 1));
  }
  if (local_e8 != (string *)local_d8) {
    operator_delete(local_e8,(ulong)(local_d8._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  _Var14._M_p = local_a8._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p == &local_a8.field_2) {
    return __return_storage_ptr__;
  }
LAB_002ecebf:
  operator_delete(_Var14._M_p,(ulong)(local_a8.field_2._M_allocated_capacity + 1));
  return __return_storage_ptr__;
}

Assistant:

Result validateMultiFunctionDescription(const Specification::ModelDescription& interface, int modelVersion, const ValidationPolicy& validationPolicy) {
        if (!validationPolicy.allowsMultipleFunctions) {
            return  Result(ResultType::MODEL_TYPE_DOES_NOT_SUPPORT_MULTI_FUNCTION,
                           "This model type doesn't support multi-function syntax.");
        }

        if (modelVersion < MLMODEL_SPECIFICATION_VERSION_IOS18) {
            return  Result(ResultType::INVALID_COMPATIBILITY_VERSION,
                           "Multi-function syntax is only valid in specification verison >= " + std::to_string(MLMODEL_SPECIFICATION_VERSION_IOS18)+
                           ". This model has version " + std::to_string(modelVersion));
        }

        const auto& functions = interface.functions();
        auto functionNames = std::vector<std::string>();
        for (const auto& function: functions) {
            Result r = validateFeatureDescriptions(function, modelVersion, validationPolicy);
            if (!r.good()) {
                return r;
            }
            functionNames.push_back(function.name());
        }

        // The default function name must be in function name list.
        const auto& defaultFunctionName = interface.defaultfunctionname();
        if (find(functionNames.begin(), functionNames.end(), defaultFunctionName) == functionNames.end()) {
            return  Result(ResultType::INVALID_DEFAULT_FUNCTION_NAME,
                           "The default function name '" + defaultFunctionName + "' is not found in the function name list: " + componentsJoinedBy(functionNames, ","));
        }

        return Result();
    }